

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

Entity * Entity::from_json(Json *json,Map *map,World *world)

{
  bool bVar1;
  uchar entity_id;
  Position PVar2;
  const_reference pvVar3;
  EntityType *this;
  Entity *this_00;
  Attributes local_438;
  Entity *local_3e8;
  Entity *entity;
  reference local_3d0;
  Json *j;
  const_iterator __end2;
  const_iterator __begin2;
  key_type local_380;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_360;
  value_type *__range2;
  key_type local_350;
  uchar local_32a;
  allocator<char> local_329;
  undefined1 local_328 [6];
  uint8_t entity_id_to_use_tiles_from;
  undefined1 local_303;
  undefined1 local_302;
  allocator<char> local_301;
  undefined1 local_300 [5];
  bool use_tiles_from_other_entity;
  allocator<char> local_2d9;
  key_type local_2d8;
  allocator<char> local_2b1;
  key_type local_2b0;
  allocator<char> local_289;
  key_type local_288;
  uchar local_262;
  allocator<char> local_261;
  key_type local_260;
  allocator<char> local_239;
  key_type local_238;
  allocator<char> local_211;
  key_type local_210;
  allocator<char> local_1e9;
  key_type local_1e8;
  allocator<char> local_1c1;
  key_type local_1c0;
  allocator<char> local_199;
  key_type local_198;
  allocator<char> local_171;
  key_type local_170;
  allocator<char> local_149;
  key_type local_148;
  allocator<char> local_121;
  key_type local_120;
  allocator<char> local_f9;
  key_type local_f8;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8 [2];
  allocator<char> local_b1;
  key_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  Attributes attrs;
  World *world_local;
  Map *map_local;
  Json *json_local;
  
  attrs._72_8_ = world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"entityType",&local_b1);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_b0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_90,pvVar3);
  this = World::entity_type(world,&local_90);
  local_70[0] = EntityType::id(this);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<const_char_(&)[9],_char[9],_0>(local_d8,(char (*) [9])"position");
  PVar2 = Position::from_json(local_d8);
  local_70._1_4_ = PVar2._0_4_;
  local_70._5_2_ = PVar2._4_2_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"orientation",&local_f9);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_f8);
  local_70[7] = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"palette",&local_121);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_120);
  attrs.type_id =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"speed",&local_149);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_148);
  attrs.position.x =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"fightable",&local_171);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_170);
  attrs.position.y =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"liftable",&local_199);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_198);
  attrs.position.z =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"canPassThrough",&local_1c1);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1c0);
  attrs.position.half_x =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"appearAfterPlayerMovedAway",&local_1e9);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1e8);
  attrs.position.half_y =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"gravityImmune",&local_211);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_210);
  attrs.position.half_z =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"talkable",&local_239);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_238);
  attrs.orientation =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"dialogue",&local_261);
  local_262 = '\0';
  attrs.palette =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::value<unsigned_char,_0>(json,&local_260,&local_262);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"behaviorId",&local_289);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_288);
  attrs._10_2_ = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator_unsigned_short<unsigned_short,_0>(pvVar3);
  attrs.dialogue = '\0';
  attrs._17_1_ = 0;
  attrs.behavior_id = 0;
  attrs._20_4_ = 0;
  attrs.entity_to_use_tiles_from = (Entity *)0x0;
  attrs.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  attrs.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector
            ((vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *)
             &attrs.entity_to_use_tiles_from);
  local_302 = 1;
  Flag::Flag((Flag *)&attrs.mask_flags.
                      super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0xff,0xff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"flagUnknown_2_3",&local_2b1);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_2b0);
  attrs.persistence_flag.byte._0_1_ =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"flagUnknown_2_4",&local_2d9);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_2d8);
  attrs.persistence_flag.byte._1_1_ =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300,"flagUnknown_3_5",&local_301);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)local_300);
  attrs.persistence_flag.bit =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_bool<bool,_0>(pvVar3);
  local_302 = 0;
  std::__cxx11::string::~string((string *)local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(local_d8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,"useTilesFromOtherEntity",&local_329);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)local_328);
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_bool<bool,_0>(pvVar3);
  std::__cxx11::string::~string((string *)local_328);
  std::allocator<char>::~allocator(&local_329);
  local_303 = bVar1;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"entityIdToUseTilesFrom",
               (allocator<char> *)((long)&__range2 + 7));
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_350);
    entity_id = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    local_32a = entity_id;
    attrs._16_8_ = Map::entity(map,entity_id);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[10],_0>(json,(char (*) [10])"maskFlags");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"maskFlags",
               (allocator<char> *)((long)&__begin2.m_it.primitive_iterator.m_it + 7));
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&__begin2.m_it.primitive_iterator.m_it + 7));
    local_360 = pvVar3;
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::begin((const_iterator *)&__end2.m_it.primitive_iterator,pvVar3);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((const_iterator *)&j,local_360);
    while (bVar1 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::
                   operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                             ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&__end2.m_it.primitive_iterator,
                              (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&j), bVar1) {
      local_3d0 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&__end2.m_it.primitive_iterator);
      EntityMaskFlag::from_json((EntityMaskFlag *)&entity,local_3d0);
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                ((vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *)
                 &attrs.entity_to_use_tiles_from,(EntityMaskFlag *)&entity);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)&__end2.m_it.primitive_iterator);
    }
  }
  this_00 = (Entity *)operator_new(0x58);
  Attributes::Attributes(&local_438,(Attributes *)local_70);
  Entity(this_00,&local_438);
  Attributes::~Attributes(&local_438);
  this_00->_map = map;
  local_3e8 = this_00;
  Attributes::~Attributes((Attributes *)local_70);
  return this_00;
}

Assistant:

Entity* Entity::from_json(const Json& json, Map* map, const World& world)
{
    Attributes attrs {
        .type_id = world.entity_type((std::string)json.at("entityType"))->id(),

        .position = Position::from_json("position"),
        .orientation = json.at("orientation"),
        .palette = json.at("palette"),
        .speed = json.at("speed"),

        .fightable = json.at("fightable"),
        .liftable = json.at("liftable"),
        .can_pass_through = json.at("canPassThrough"),
        .appear_after_player_moved_away = json.at("appearAfterPlayerMovedAway"),
        .gravity_immune = json.at("gravityImmune"),

        .talkable = json.at("talkable"),
        .dialogue = json.value<uint8_t>("dialogue", 0),

        .behavior_id = json.at("behaviorId"),

        .flag_unknown_2_3 = json.at("flagUnknown_2_3"),
        .flag_unknown_2_4 = json.at("flagUnknown_2_4"),
        .flag_unknown_3_5 = json.at("flagUnknown_3_5"),
    };

    bool use_tiles_from_other_entity = json.at("useTilesFromOtherEntity");
    if(use_tiles_from_other_entity)
    {
        uint8_t entity_id_to_use_tiles_from = json.at("entityIdToUseTilesFrom");
        attrs.entity_to_use_tiles_from = map->entity(entity_id_to_use_tiles_from);
    }

    if(json.contains("maskFlags"))
    {
        for(const Json& j : json.at("maskFlags"))
            attrs.mask_flags.emplace_back(EntityMaskFlag::from_json(j));
    }

    Entity* entity = new Entity(attrs);
    entity->_map = map;

    return entity;
}